

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O2

int64_t GetTransactionSigOpCost(CTransaction *tx,CCoinsViewCache *inputs,uint32_t flags)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  uint uVar4;
  Coin *pCVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = GetLegacySigOpCount(tx);
  uVar7 = (ulong)(uVar4 << 2);
  bVar3 = CTransaction::IsCoinBase(tx);
  if (!bVar3) {
    if ((flags & 1) != 0) {
      uVar4 = GetP2SHSigOpCount(tx,inputs);
      uVar7 = uVar7 + (uVar4 << 2);
    }
    uVar4 = 0;
    while( true ) {
      uVar8 = (ulong)uVar4;
      pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68) <= uVar8) break;
      pCVar5 = CCoinsViewCache::AccessCoin(inputs,&pCVar2[uVar8].prevout);
      if ((pCVar5->out).nValue == -1) {
        __assert_fail("!coin.IsSpent()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/consensus/tx_verify.cpp"
                      ,0x9d,
                      "int64_t GetTransactionSigOpCost(const CTransaction &, const CCoinsViewCache &, uint32_t)"
                     );
      }
      pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = CountWitnessSigOps(&pCVar2[uVar8].scriptSig,&(pCVar5->out).scriptPubKey,
                                 &pCVar2[uVar8].scriptWitness,flags);
      uVar7 = uVar7 + sVar6;
      uVar4 = uVar4 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar7;
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetTransactionSigOpCost(const CTransaction& tx, const CCoinsViewCache& inputs, uint32_t flags)
{
    int64_t nSigOps = GetLegacySigOpCount(tx) * WITNESS_SCALE_FACTOR;

    if (tx.IsCoinBase())
        return nSigOps;

    if (flags & SCRIPT_VERIFY_P2SH) {
        nSigOps += GetP2SHSigOpCount(tx, inputs) * WITNESS_SCALE_FACTOR;
    }

    for (unsigned int i = 0; i < tx.vin.size(); i++)
    {
        const Coin& coin = inputs.AccessCoin(tx.vin[i].prevout);
        assert(!coin.IsSpent());
        const CTxOut &prevout = coin.out;
        nSigOps += CountWitnessSigOps(tx.vin[i].scriptSig, prevout.scriptPubKey, &tx.vin[i].scriptWitness, flags);
    }
    return nSigOps;
}